

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<char_const*,char_const*,char_const*>
               (string *s,char *fmt,char **v,char **args,char **args_1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char **in_RCX;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  char **in_R8;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string local_250 [32];
  string *in_stack_fffffffffffffdd0;
  char **in_stack_fffffffffffffdd8;
  char **in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  string local_208 [32];
  stringstream local_1e8 [16];
  ostream local_1d8 [48];
  char *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  LogLevel in_stack_fffffffffffffe74;
  string local_48 [32];
  
  copyToFormatString(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  lVar1 = std::__cxx11::string::find((char)local_48,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_48,0x73);
  lVar3 = std::__cxx11::string::find((char)local_48,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
             in_stack_fffffffffffffe58);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
             in_stack_fffffffffffffe58);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
               in_stack_fffffffffffffe58);
    }
    std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(in_RDI,local_250);
    std::__cxx11::string::~string(local_250);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1e8);
    std::operator<<(local_1d8,*(char **)in_RDX);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(in_RDI,local_208);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::__cxx11::stringstream::~stringstream(local_1e8);
  }
  stringPrintfRecursive<char_const*,char_const*>(in_RSI,in_RDX,in_RCX,in_R8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}